

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threading_thread_id.c
# Opt level: O1

uint64_t thread_id_get_current(void)

{
  uint64_t uVar1;
  
  uVar1 = syscall(0xba);
  return uVar1;
}

Assistant:

uint64_t thread_id_get_current(void)
{
#if defined(_WIN32)
	return (uint64_t)GetCurrentThreadId();
#elif defined(__linux__)
	#if defined(__ANDROID__) && defined(__ANDROID_API__) && (__ANDROID_API__ < 21)
	return (uint64_t)syscall(__NR_gettid);
	#else
	return (uint64_t)syscall(SYS_gettid);
	#endif
#elif (defined(__APPLE__) && defined(__MACH__)) || defined(__MACOSX__)
	#if defined(MAC_OS_X_VERSION_10_12) && MAC_OS_X_VERSION_MAX_ALLOWED >= MAC_OS_X_VERSION_10_12
	uint64_t thread_id;

	pthread_threadid_np(NULL, &thread_id);

	return (uint64_t)thread_id;
	#else
	return (uint64_t)syscall(SYS_thread_selfid);
	#endif
#elif defined(__FreeBSD__)
	long thread_id = 0;

	thr_self(&thread_id);

	return (thread_id < 0) ? 0 : (uint64_t)thread_id;
#elif defined(__HAIKU__) || defined(__BEOS__)
	return (uint64_t)thread_get_current_thread_id();
#else
	return THREAD_ID_INVALID;
#endif
}